

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfdrivr.c
# Opt level: O2

FT_Error BDF_Size_Request(FT_Size size,FT_Size_Request req)

{
  long lVar1;
  long lVar2;
  FT_Error FVar3;
  
  lVar2 = size->face[1].face_flags;
  lVar1 = req->height;
  if ((ulong)req->vertResolution != 0) {
    lVar1 = (long)(lVar1 * (ulong)req->vertResolution + 0x24) / 0x48;
  }
  if (req->type == FT_SIZE_REQUEST_TYPE_REAL_DIM) {
    lVar2 = *(long *)(lVar2 + 0x48) + *(long *)(lVar2 + 0x40);
  }
  else {
    if (req->type != FT_SIZE_REQUEST_TYPE_NOMINAL) {
      return 7;
    }
    lVar2 = size->face->available_sizes->y_ppem + 0x20 >> 6;
  }
  if (lVar1 + 0x20 >> 6 == lVar2) {
    FVar3 = 0;
    BDF_Size_Select(size,0);
  }
  else {
    FVar3 = 0x17;
  }
  return FVar3;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  BDF_Size_Request( FT_Size          size,
                    FT_Size_Request  req )
  {
    FT_Face          face    = size->face;
    FT_Bitmap_Size*  bsize   = face->available_sizes;
    bdf_font_t*      bdffont = ( (BDF_Face)face )->bdffont;
    FT_Error         error   = FT_ERR( Invalid_Pixel_Size );
    FT_Long          height;


    height = FT_REQUEST_HEIGHT( req );
    height = ( height + 32 ) >> 6;

    switch ( req->type )
    {
    case FT_SIZE_REQUEST_TYPE_NOMINAL:
      if ( height == ( ( bsize->y_ppem + 32 ) >> 6 ) )
        error = FT_Err_Ok;
      break;

    case FT_SIZE_REQUEST_TYPE_REAL_DIM:
      if ( height == ( bdffont->font_ascent +
                       bdffont->font_descent ) )
        error = FT_Err_Ok;
      break;

    default:
      error = FT_THROW( Unimplemented_Feature );
      break;
    }

    if ( error )
      return error;
    else
      return BDF_Size_Select( size, 0 );
  }